

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O2

void __thiscall
math::wide_integer::uintwide_t<48U,_unsigned_short,_void,_false>::shr<unsigned_long>
          (uintwide_t<48U,_unsigned_short,_void,_false> *this,unsigned_long n)

{
  ushort uVar1;
  byte bVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  
  uVar5 = 3;
  if (n >> 4 < 3) {
    uVar5 = n >> 4;
  }
  bVar2 = (byte)n & 0xf;
  if (0xf < n) {
    for (lVar6 = 0; uVar5 * -2 + 6 != lVar6; lVar6 = lVar6 + 2) {
      *(undefined2 *)(this + lVar6) = *(undefined2 *)(this + lVar6 + uVar5 * 2);
    }
    for (uVar3 = uVar5 * 2 ^ 6; uVar3 != 6; uVar3 = uVar3 + 2) {
      *(undefined2 *)(this + uVar3) = 0;
    }
  }
  if ((n & 0xf) != 0) {
    iVar4 = 0;
    for (lVar6 = (uVar5 ^ 3) * 2; lVar6 != 0; lVar6 = lVar6 + -2) {
      uVar1 = *(ushort *)(this + lVar6 + -2);
      *(ushort *)(this + lVar6 + -2) = uVar1 >> bVar2 | (ushort)iVar4;
      iVar4 = (uint)uVar1 << (0x10 - bVar2 & 0x1f);
    }
  }
  return;
}

Assistant:

constexpr auto shr(IntegralType n) -> void
    {
      const auto offset =
        (detail::min_unsafe)(static_cast<unsigned_fast_type>(static_cast<unsigned_fast_type>(n) / static_cast<unsigned_fast_type>(std::numeric_limits<limb_type>::digits)),
                             static_cast<unsigned_fast_type>(number_of_limbs));

      const auto right_shift_amount = static_cast<std::uint_fast16_t>(static_cast<unsigned_fast_type>(n) % static_cast<unsigned_fast_type>(std::numeric_limits<limb_type>::digits));

      if(static_cast<size_t>(offset) > static_cast<size_t>(UINT8_C(0)))
      {
        detail::copy_unsafe(detail::advance_and_point(values.cbegin(), static_cast<size_t>(offset)),
                            detail::advance_and_point(values.cbegin(), static_cast<size_t>(number_of_limbs)),
                            values.begin());

        detail::fill_unsafe(detail::advance_and_point(values.begin(), static_cast<size_t>(static_cast<size_t>(number_of_limbs) - static_cast<size_t>(offset))),
                            values.end(),
                            right_shift_fill_value());
      }

      using local_integral_type = unsigned_fast_type;

      if(right_shift_amount != static_cast<local_integral_type>(UINT8_C(0)))
      {
        auto part_from_previous_value =
          static_cast<limb_type>
          (
            (!is_neg(*this))
              ? static_cast<limb_type>(UINT8_C(0))
              : static_cast<limb_type>((std::numeric_limits<limb_type>::max)() << static_cast<std::uint_fast16_t>(static_cast<std::uint_fast16_t>(std::numeric_limits<limb_type>::digits) - right_shift_amount))
          );

        auto r_ai =
          static_cast<reverse_iterator>
          (
            detail::advance_and_point
            (
              values.begin(),
              static_cast<signed_fast_type>
              (
                static_cast<unsigned_fast_type>(number_of_limbs) - offset
              )
            )
          );

        while(r_ai != values.rend()) // NOLINT(altera-id-dependent-backward-branch)
        {
          const auto t = *r_ai;

          *r_ai++ = static_cast<limb_type>(static_cast<limb_type>(t >> static_cast<local_integral_type>(right_shift_amount)) | part_from_previous_value);

          const auto left_shift_previous_value =
            static_cast<local_integral_type>
            (
              static_cast<unsigned_fast_type>
              (
                  static_cast<std::int_fast32_t>(std::numeric_limits<limb_type>::digits)
                - static_cast<std::int_fast32_t>(right_shift_amount)
              )
            );

          part_from_previous_value = static_cast<limb_type>(t << left_shift_previous_value);
        }
      }
    }